

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

String * kj::_::generateExtensionResponse
                   (String *__return_storage_ptr__,CompressionParameters *parameters)

{
  char *pcVar1;
  size_t sVar2;
  char (*in_RCX) [29];
  char (*pacVar3) [29];
  char (*in_RDX) [19];
  char (*in_R8) [29];
  String response;
  unsigned_long w;
  String local_58;
  String local_38;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_18;
  
  str<char_const(&)[19]>(&local_58,(kj *)"permessage-deflate",in_RDX);
  if (parameters->inboundNoContextTakeover == true) {
    str<kj::String&,char_const(&)[29]>
              (&local_38,(kj *)&local_58,(String *)"; client_no_context_takeover",in_RCX);
    pacVar3 = (char (*) [29])local_58.content.size_;
    pcVar1 = local_58.content.ptr;
    if (local_58.content.ptr != (char *)0x0) {
      local_58.content.ptr = (char *)0x0;
      local_58.content.size_ = 0;
      in_R8 = pacVar3;
      (**(local_58.content.disposer)->_vptr_ArrayDisposer)
                (local_58.content.disposer,pcVar1,1,pacVar3,pacVar3,0);
      in_RCX = pacVar3;
    }
    local_58.content.ptr = local_38.content.ptr;
    local_58.content.size_ = local_38.content.size_;
    local_58.content.disposer = local_38.content.disposer;
  }
  if (parameters->outboundNoContextTakeover == true) {
    str<kj::String&,char_const(&)[29]>
              (&local_38,(kj *)&local_58,(String *)"; server_no_context_takeover",in_RCX);
    pacVar3 = (char (*) [29])local_58.content.size_;
    pcVar1 = local_58.content.ptr;
    if (local_58.content.ptr != (char *)0x0) {
      local_58.content.ptr = (char *)0x0;
      local_58.content.size_ = 0;
      (**(local_58.content.disposer)->_vptr_ArrayDisposer)
                (local_58.content.disposer,pcVar1,1,pacVar3,pacVar3,0);
      in_R8 = pacVar3;
    }
    local_58.content.ptr = local_38.content.ptr;
    local_58.content.size_ = local_38.content.size_;
    local_58.content.disposer = local_38.content.disposer;
  }
  if ((parameters->inboundMaxWindowBits).ptr.isSet == true) {
    local_18 = (parameters->inboundMaxWindowBits).ptr.field_1;
    str<kj::String&,char_const(&)[26],unsigned_long&>
              (&local_38,(kj *)&local_58,(String *)"; client_max_window_bits=",
               (char (*) [26])&local_18,(unsigned_long *)in_R8);
    pacVar3 = (char (*) [29])local_58.content.size_;
    pcVar1 = local_58.content.ptr;
    if (local_58.content.ptr != (char *)0x0) {
      local_58.content.ptr = (char *)0x0;
      local_58.content.size_ = 0;
      (**(local_58.content.disposer)->_vptr_ArrayDisposer)
                (local_58.content.disposer,pcVar1,1,pacVar3,pacVar3,0);
      in_R8 = pacVar3;
    }
    local_58.content.ptr = local_38.content.ptr;
    local_58.content.size_ = local_38.content.size_;
    local_58.content.disposer = local_38.content.disposer;
  }
  if ((parameters->outboundMaxWindowBits).ptr.isSet == true) {
    local_18 = (parameters->outboundMaxWindowBits).ptr.field_1;
    str<kj::String&,char_const(&)[26],unsigned_long&>
              (&local_38,(kj *)&local_58,(String *)"; server_max_window_bits=",
               (char (*) [26])&local_18,(unsigned_long *)in_R8);
    sVar2 = local_58.content.size_;
    pcVar1 = local_58.content.ptr;
    if (local_58.content.ptr != (char *)0x0) {
      local_58.content.ptr = (char *)0x0;
      local_58.content.size_ = 0;
      (**(local_58.content.disposer)->_vptr_ArrayDisposer)
                (local_58.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
    local_58.content.ptr = local_38.content.ptr;
    local_58.content.size_ = local_38.content.size_;
    local_58.content.disposer = local_38.content.disposer;
  }
  (__return_storage_ptr__->content).ptr = local_58.content.ptr;
  (__return_storage_ptr__->content).size_ = local_58.content.size_;
  (__return_storage_ptr__->content).disposer = local_58.content.disposer;
  return __return_storage_ptr__;
}

Assistant:

kj::String generateExtensionResponse(const CompressionParameters& parameters) {
  // Build the `Sec-WebSocket-Extensions` response from the agreed parameters.
  kj::String response = kj::str("permessage-deflate");
  if (parameters.inboundNoContextTakeover) {
    response = kj::str(response, "; client_no_context_takeover");
  }
  if (parameters.outboundNoContextTakeover) {
    response = kj::str(response, "; server_no_context_takeover");
  }
  if (parameters.inboundMaxWindowBits != kj::none) {
    auto w = KJ_REQUIRE_NONNULL(parameters.inboundMaxWindowBits);
    response = kj::str(response, "; client_max_window_bits=", w);
  }
  if (parameters.outboundMaxWindowBits != kj::none) {
    auto w = KJ_REQUIRE_NONNULL(parameters.outboundMaxWindowBits);
    response = kj::str(response, "; server_max_window_bits=", w);
  }
  return kj::mv(response);
}